

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts3EvalTokenCosts(Fts3Cursor *pCsr,Fts3Expr *pRoot,Fts3Expr *pExpr,Fts3TokenAndCost **ppTC,
                       Fts3Expr ***ppOr,int *pRc)

{
  int iVar1;
  Fts3Phrase *pFVar2;
  Fts3TokenAndCost *pFVar3;
  Fts3MultiSegReader *pFVar4;
  Fts3Table *p;
  Fts3SegReader *pFVar5;
  int iVar6;
  long lVar7;
  Fts3Expr ***pnLoad;
  long lVar8;
  int iVar9;
  sqlite3_int64 iBlockid;
  long in_FS_OFFSET;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pnLoad = ppOr;
  do {
    if (*pRc != 0) goto LAB_001b1eec;
    iVar6 = pExpr->eType;
    if (iVar6 == 4) {
      pRoot = pExpr->pLeft;
      **ppOr = pRoot;
      *ppOr = *ppOr + 1;
    }
    else {
      if (iVar6 == 2) goto LAB_001b1eec;
      if (iVar6 == 5) {
        pFVar2 = pExpr->pPhrase;
        iVar6 = 0;
        for (lVar7 = 0; (iVar6 == 0 && (lVar7 < pFVar2->nToken)); lVar7 = lVar7 + 1) {
          pFVar3 = *ppTC;
          *ppTC = pFVar3 + 1;
          pFVar3->pPhrase = pFVar2;
          pFVar3->iToken = (int)lVar7;
          pFVar3->pRoot = pRoot;
          pFVar3->pToken = pFVar2->aToken + lVar7;
          pFVar3->iCol = pFVar2->iColumn;
          pFVar4 = pFVar2->aToken[lVar7].pSegcsr;
          p = (Fts3Table *)(pCsr->base).pVtab;
          iVar1 = p->nPgsz;
          iVar6 = 0;
          iVar9 = 0;
          for (lVar8 = 0; (iVar6 == 0 && (lVar8 < pFVar4->nSegment)); lVar8 = lVar8 + 1) {
            pFVar5 = pFVar4->apSegment[lVar8];
            iVar6 = 0;
            if ((pFVar5->ppNextElem == (Fts3HashElem **)0x0) && (pFVar5->rootOnly == '\0')) {
              for (iBlockid = pFVar5->iStartBlock; iBlockid <= pFVar5->iLeafEndBlock;
                  iBlockid = iBlockid + 1) {
                local_3c = -0x55555556;
                iVar6 = sqlite3Fts3ReadBlock(p,iBlockid,(char **)0x0,&local_3c,(int *)pnLoad);
                if (iVar6 != 0) goto LAB_001b1eb4;
                if (iVar1 < local_3c + 0x23) {
                  iVar9 = iVar9 + (local_3c + 0x22) / iVar1;
                }
              }
              iVar6 = 0;
            }
LAB_001b1eb4:
          }
          pFVar3->nOvfl = iVar9;
          *pRc = iVar6;
        }
LAB_001b1eec:
        if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
          __stack_chk_fail();
        }
        return;
      }
    }
    pnLoad = ppOr;
    fts3EvalTokenCosts(pCsr,pRoot,pExpr->pLeft,ppTC,ppOr,pRc);
    if (pExpr->eType == 4) {
      pRoot = pExpr->pRight;
      **ppOr = pRoot;
      *ppOr = *ppOr + 1;
    }
    pExpr = pExpr->pRight;
  } while( true );
}

Assistant:

static void fts3EvalTokenCosts(
  Fts3Cursor *pCsr,               /* FTS Cursor handle */
  Fts3Expr *pRoot,                /* Root of current AND/NEAR cluster */
  Fts3Expr *pExpr,                /* Expression to consider */
  Fts3TokenAndCost **ppTC,        /* Write new entries to *(*ppTC)++ */
  Fts3Expr ***ppOr,               /* Write new OR root to *(*ppOr)++ */
  int *pRc                        /* IN/OUT: Error code */
){
  if( *pRc==SQLITE_OK ){
    if( pExpr->eType==FTSQUERY_PHRASE ){
      Fts3Phrase *pPhrase = pExpr->pPhrase;
      int i;
      for(i=0; *pRc==SQLITE_OK && i<pPhrase->nToken; i++){
        Fts3TokenAndCost *pTC = (*ppTC)++;
        pTC->pPhrase = pPhrase;
        pTC->iToken = i;
        pTC->pRoot = pRoot;
        pTC->pToken = &pPhrase->aToken[i];
        pTC->iCol = pPhrase->iColumn;
        *pRc = sqlite3Fts3MsrOvfl(pCsr, pTC->pToken->pSegcsr, &pTC->nOvfl);
      }
    }else if( pExpr->eType!=FTSQUERY_NOT ){
      assert( pExpr->eType==FTSQUERY_OR
           || pExpr->eType==FTSQUERY_AND
           || pExpr->eType==FTSQUERY_NEAR
      );
      assert( pExpr->pLeft && pExpr->pRight );
      if( pExpr->eType==FTSQUERY_OR ){
        pRoot = pExpr->pLeft;
        **ppOr = pRoot;
        (*ppOr)++;
      }
      fts3EvalTokenCosts(pCsr, pRoot, pExpr->pLeft, ppTC, ppOr, pRc);
      if( pExpr->eType==FTSQUERY_OR ){
        pRoot = pExpr->pRight;
        **ppOr = pRoot;
        (*ppOr)++;
      }
      fts3EvalTokenCosts(pCsr, pRoot, pExpr->pRight, ppTC, ppOr, pRc);
    }
  }
}